

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void * prf_array_insert_int(void *id,int idx,int elem)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  
  uVar1 = *(uint *)((long)id + -4);
  pvVar2 = prf_array_append_int(id,elem);
  if (idx < (int)(uVar1 >> 4)) {
    uVar3 = (ulong)(uVar1 >> 4);
    do {
      *(undefined4 *)((long)pvVar2 + uVar3 * 4) = *(undefined4 *)((long)pvVar2 + uVar3 * 4 + -4);
      uVar3 = uVar3 - 1;
    } while ((long)idx < (long)uVar3);
    *(int *)((long)pvVar2 + (long)idx * 4) = elem;
  }
  return pvVar2;
}

Assistant:

void *
prf_array_insert_int(void *id, int idx, int elem)
{
  int i, n;
  int *ptr;

  n = id_to_array(id)->numelem;

  /* make room for one more */
  ptr = (int*)prf_array_append_int(id, elem);

  if (idx < n) {
    for (i = n; i > idx; i--) {
      ptr[i] = ptr[i-1]; 
    }
    ptr[idx] = elem;
  }
  return ptr;
}